

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_set_value(JSON_Object *object,char *name,JSON_Value *value)

{
  size_t n;
  unsigned_long uVar1;
  JSON_Value *pJVar2;
  JSON_Value *in_RDX;
  char *in_RSI;
  JSON_Object *in_RDI;
  JSON_Status res;
  char *key_copy;
  JSON_Value *old_value;
  size_t item_ix;
  size_t cell_ix;
  parson_bool_t found;
  unsigned_long hash;
  JSON_Object *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  unsigned_long hash_00;
  size_t key_len;
  char *pcVar3;
  JSON_Object *pJVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  JSON_Status JVar5;
  
  pJVar4 = (JSON_Object *)0x0;
  pcVar3 = (char *)0x0;
  key_len = 0;
  hash_00 = 0;
  if ((((in_RDI == (JSON_Object *)0x0) || (in_RSI == (char *)0x0)) || (in_RDX == (JSON_Value *)0x0))
     || (in_RDX->parent != (JSON_Value *)0x0)) {
    JVar5 = -1;
  }
  else {
    n = strlen(in_RSI);
    uVar1 = hash_string(in_RSI,n);
    strlen(in_RSI);
    pJVar4 = (JSON_Object *)
             json_object_get_cell_ix
                       (pJVar4,pcVar3,key_len,hash_00,
                        (parson_bool_t *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (in_RDI->item_capacity <= in_RDI->count) {
      JVar5 = json_object_grow_and_rehash
                        ((JSON_Object *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (JVar5 != 0) {
        return -1;
      }
      in_stack_ffffffffffffff80 = in_RDI;
      strlen(in_RSI);
      pJVar4 = (JSON_Object *)
               json_object_get_cell_ix
                         (pJVar4,pcVar3,key_len,hash_00,
                          (parson_bool_t *)CONCAT44(JVar5,in_stack_ffffffffffffffa8));
    }
    pcVar3 = parson_strdup((char *)in_stack_ffffffffffffff80);
    if (pcVar3 == (char *)0x0) {
      JVar5 = -1;
    }
    else {
      in_RDI->names[in_RDI->count] = pcVar3;
      in_RDI->cells[(long)pJVar4] = in_RDI->count;
      in_RDI->values[in_RDI->count] = in_RDX;
      in_RDI->cell_ixs[in_RDI->count] = (size_t)pJVar4;
      in_RDI->hashes[in_RDI->count] = uVar1;
      in_RDI->count = in_RDI->count + 1;
      pJVar2 = json_object_get_wrapping_value(in_RDI);
      in_RDX->parent = pJVar2;
      JVar5 = 0;
    }
  }
  return JVar5;
}

Assistant:

JSON_Status json_object_set_value(JSON_Object *object, const char *name, JSON_Value *value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    JSON_Value *old_value = NULL;
    char *key_copy = NULL;

    if (!object || !name || !value || value->parent) {
        return JSONFailure;
    }
    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (found) {
        item_ix = object->cells[cell_ix];
        old_value = object->values[item_ix];
        json_value_free(old_value);
        object->values[item_ix] = value;
        value->parent = json_object_get_wrapping_value(object);
        return JSONSuccess;
    }
    if (object->count >= object->item_capacity) {
        JSON_Status res = json_object_grow_and_rehash(object);
        if (res != JSONSuccess) {
            return JSONFailure;
        }
        cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    }
    key_copy = parson_strdup(name);
    if (!key_copy) {
        return JSONFailure;
    }
    object->names[object->count] = key_copy;
    object->cells[cell_ix] = object->count;
    object->values[object->count] = value;
    object->cell_ixs[object->count] = cell_ix;
    object->hashes[object->count] = hash;
    object->count++;
    value->parent = json_object_get_wrapping_value(object);
    return JSONSuccess;
}